

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O2

void __thiscall
udpdiscovery::impl::PeerEnv::decreaseRefCountAndMaybeDestroySelfAndUnlock(PeerEnv *this)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = this->ref_count_;
  this->ref_count_ = iVar1 + -1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  if (iVar1 < 2) {
    if (iVar1 != 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Strangly ref count is less than 0.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    (*(this->super_PeerEnvInterface)._vptr_PeerEnvInterface[1])(this);
    return;
  }
  return;
}

Assistant:

void decreaseRefCountAndMaybeDestroySelfAndUnlock() {
    --ref_count_;
    int cur_ref_count = ref_count_;

    // This method is performed when the mutex is locked.
    lock_.Unlock();

    if (cur_ref_count <= 0) {
      if (cur_ref_count < 0) {
        // Shouldn't be there.
        std::cerr << "Strangly ref count is less than 0." << std::endl;
      }

      delete this;
    }
  }